

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_json_relation.cpp
# Opt level: O3

void __thiscall duckdb::ReadJSONRelation::~ReadJSONRelation(ReadJSONRelation *this)

{
  pointer pcVar1;
  
  (this->super_TableFunctionRelation).super_Relation._vptr_Relation =
       (_func_int **)&PTR__ReadJSONRelation_02462580;
  pcVar1 = (this->alias)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->alias).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->json_file)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->json_file).field_2) {
    operator_delete(pcVar1);
  }
  TableFunctionRelation::~TableFunctionRelation(&this->super_TableFunctionRelation);
  return;
}

Assistant:

ReadJSONRelation::~ReadJSONRelation() {
}